

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::GELU_x86_avx::forward_inplace(GELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float in_register_0000125c;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar33;
  float fVar35;
  float fVar37;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  float fVar34;
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  float in_register_0000129c;
  undefined1 auVar31 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_GELU_x86_avx[-3]) != 0) {
    iVar10 = bottom_top_blob->c;
    if (0 < (long)iVar10) {
      uVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar13 = 0;
      do {
        auVar43._8_4_ = 0x41100000;
        auVar43._0_8_ = 0x4110000041100000;
        auVar41._8_4_ = 0xc1100000;
        auVar41._0_8_ = 0xc1100000c1100000;
        auVar43._12_4_ = 0x41100000;
        auVar41._12_4_ = 0xc1100000;
        auVar43._16_4_ = 0x41100000;
        auVar41._16_4_ = 0xc1100000;
        auVar43._20_4_ = 0x41100000;
        auVar41._20_4_ = 0xc1100000;
        auVar43._24_4_ = 0x41100000;
        auVar41._24_4_ = 0xc1100000;
        auVar43._28_4_ = 0x41100000;
        auVar41._28_4_ = 0xc1100000;
        pauVar14 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar13 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar12 < 8) {
          uVar9 = 0;
        }
        else {
          iVar8 = 7;
          do {
            fVar5 = *(float *)*pauVar14;
            fVar27 = *(float *)(*pauVar14 + 4);
            fVar33 = *(float *)(*pauVar14 + 8);
            fVar35 = *(float *)(*pauVar14 + 0xc);
            fVar37 = *(float *)(*pauVar14 + 0x10);
            fVar6 = *(float *)(*pauVar14 + 0x14);
            fVar7 = *(float *)(*pauVar14 + 0x18);
            auVar1._4_4_ = (fVar27 * fVar27 * fVar27 * 0.044715 + fVar27) * 0.7978845;
            auVar1._0_4_ = (fVar5 * fVar5 * fVar5 * 0.044715 + fVar5) * 0.7978845;
            auVar1._8_4_ = (fVar33 * fVar33 * fVar33 * 0.044715 + fVar33) * 0.7978845;
            auVar1._12_4_ = (fVar35 * fVar35 * fVar35 * 0.044715 + fVar35) * 0.7978845;
            auVar1._16_4_ = (fVar37 * fVar37 * fVar37 * 0.044715 + fVar37) * 0.7978845;
            auVar1._20_4_ = (fVar6 * fVar6 * fVar6 * 0.044715 + fVar6) * 0.7978845;
            auVar1._24_4_ = (fVar7 * fVar7 * fVar7 * 0.044715 + fVar7) * 0.7978845;
            auVar1._28_4_ = in_register_0000125c + *(float *)(*pauVar14 + 0x1c);
            auVar1 = vmaxps_avx(auVar41,auVar1);
            auVar1 = vminps_avx(auVar43,auVar1);
            fVar17 = auVar1._0_4_;
            fVar26 = fVar17 * fVar17;
            fVar20 = auVar1._4_4_;
            fVar32 = fVar20 * fVar20;
            fVar21 = auVar1._8_4_;
            fVar34 = fVar21 * fVar21;
            fVar22 = auVar1._12_4_;
            fVar36 = fVar22 * fVar22;
            fVar23 = auVar1._16_4_;
            fVar38 = fVar23 * fVar23;
            fVar24 = auVar1._20_4_;
            fVar39 = fVar24 * fVar24;
            fVar25 = auVar1._24_4_;
            fVar40 = fVar25 * fVar25;
            fVar17 = ((((((fVar26 * -2.7607684e-16 + 2.000188e-13) * fVar26 + -8.604672e-11) *
                         fVar26 + 5.1222973e-08) * fVar26 + 1.48572235e-05) * fVar26 + 0.00063726195
                      ) * fVar26 + 0.0048935246) * fVar17;
            fVar20 = ((((((fVar32 * -2.7607684e-16 + 2.000188e-13) * fVar32 + -8.604672e-11) *
                         fVar32 + 5.1222973e-08) * fVar32 + 1.48572235e-05) * fVar32 + 0.00063726195
                      ) * fVar32 + 0.0048935246) * fVar20;
            auVar2._4_4_ = fVar20;
            auVar2._0_4_ = fVar17;
            fVar21 = ((((((fVar34 * -2.7607684e-16 + 2.000188e-13) * fVar34 + -8.604672e-11) *
                         fVar34 + 5.1222973e-08) * fVar34 + 1.48572235e-05) * fVar34 + 0.00063726195
                      ) * fVar34 + 0.0048935246) * fVar21;
            auVar2._8_4_ = fVar21;
            fVar22 = ((((((fVar36 * -2.7607684e-16 + 2.000188e-13) * fVar36 + -8.604672e-11) *
                         fVar36 + 5.1222973e-08) * fVar36 + 1.48572235e-05) * fVar36 + 0.00063726195
                      ) * fVar36 + 0.0048935246) * fVar22;
            auVar2._12_4_ = fVar22;
            fVar23 = ((((((fVar38 * -2.7607684e-16 + 2.000188e-13) * fVar38 + -8.604672e-11) *
                         fVar38 + 5.1222973e-08) * fVar38 + 1.48572235e-05) * fVar38 + 0.00063726195
                      ) * fVar38 + 0.0048935246) * fVar23;
            auVar2._16_4_ = fVar23;
            fVar24 = ((((((fVar39 * -2.7607684e-16 + 2.000188e-13) * fVar39 + -8.604672e-11) *
                         fVar39 + 5.1222973e-08) * fVar39 + 1.48572235e-05) * fVar39 + 0.00063726195
                      ) * fVar39 + 0.0048935246) * fVar24;
            auVar2._20_4_ = fVar24;
            fVar25 = ((((((fVar40 * -2.7607684e-16 + 2.000188e-13) * fVar40 + -8.604672e-11) *
                         fVar40 + 5.1222973e-08) * fVar40 + 1.48572235e-05) * fVar40 + 0.00063726195
                      ) * fVar40 + 0.0048935246) * fVar25;
            auVar2._24_4_ = fVar25;
            auVar2._28_4_ = auVar1._28_4_;
            auVar31._0_4_ =
                 ((fVar26 * 1.1982584e-06 + 0.00011853471) * fVar26 + 0.0022684347) * fVar26 +
                 0.0048935246;
            auVar31._4_4_ =
                 ((fVar32 * 1.1982584e-06 + 0.00011853471) * fVar32 + 0.0022684347) * fVar32 +
                 0.0048935246;
            auVar31._8_4_ =
                 ((fVar34 * 1.1982584e-06 + 0.00011853471) * fVar34 + 0.0022684347) * fVar34 +
                 0.0048935246;
            auVar31._12_4_ =
                 ((fVar36 * 1.1982584e-06 + 0.00011853471) * fVar36 + 0.0022684347) * fVar36 +
                 0.0048935246;
            auVar31._16_4_ =
                 ((fVar38 * 1.1982584e-06 + 0.00011853471) * fVar38 + 0.0022684347) * fVar38 +
                 0.0048935246;
            auVar31._20_4_ =
                 ((fVar39 * 1.1982584e-06 + 0.00011853471) * fVar39 + 0.0022684347) * fVar39 +
                 0.0048935246;
            auVar31._24_4_ =
                 ((fVar40 * 1.1982584e-06 + 0.00011853471) * fVar40 + 0.0022684347) * fVar40 +
                 0.0048935246;
            auVar31._28_4_ = in_register_0000129c + 0.0048935246;
            auVar1 = vrcpps_avx(auVar31);
            fVar17 = fVar17 * auVar1._0_4_;
            fVar20 = fVar20 * auVar1._4_4_;
            fVar21 = fVar21 * auVar1._8_4_;
            fVar22 = fVar22 * auVar1._12_4_;
            fVar23 = fVar23 * auVar1._16_4_;
            fVar24 = fVar24 * auVar1._20_4_;
            fVar25 = fVar25 * auVar1._24_4_;
            auVar3._4_4_ = auVar31._4_4_ * fVar20;
            auVar3._0_4_ = auVar31._0_4_ * fVar17;
            auVar3._8_4_ = auVar31._8_4_ * fVar21;
            auVar3._12_4_ = auVar31._12_4_ * fVar22;
            auVar3._16_4_ = auVar31._16_4_ * fVar23;
            auVar3._20_4_ = auVar31._20_4_ * fVar24;
            auVar3._24_4_ = auVar31._24_4_ * fVar25;
            auVar3._28_4_ = auVar31._28_4_;
            auVar2 = vsubps_avx(auVar2,auVar3);
            in_register_0000125c = auVar2._28_4_ + 1.0022684;
            in_register_0000129c = 0.5;
            auVar4._4_4_ = fVar27 * 0.5 * (fVar20 + 1.0 + auVar1._4_4_ * auVar2._4_4_);
            auVar4._0_4_ = fVar5 * 0.5 * (fVar17 + 1.0 + auVar1._0_4_ * auVar2._0_4_);
            auVar4._8_4_ = fVar33 * 0.5 * (fVar21 + 1.0 + auVar1._8_4_ * auVar2._8_4_);
            auVar4._12_4_ = fVar35 * 0.5 * (fVar22 + 1.0 + auVar1._12_4_ * auVar2._12_4_);
            auVar4._16_4_ = fVar37 * 0.5 * (fVar23 + 1.0 + auVar1._16_4_ * auVar2._16_4_);
            auVar4._20_4_ = fVar6 * 0.5 * (fVar24 + 1.0 + auVar1._20_4_ * auVar2._20_4_);
            auVar4._24_4_ = fVar7 * 0.5 * (fVar25 + 1.0 + auVar1._24_4_ * auVar2._24_4_);
            auVar4._28_4_ = *(float *)(*pauVar14 + 0x1c);
            *pauVar14 = auVar4;
            pauVar14 = pauVar14 + 1;
            iVar8 = iVar8 + 8;
            uVar9 = uVar12 & 0xfffffff8;
          } while (iVar8 < (int)uVar12);
        }
        auVar42._8_4_ = 0x41100000;
        auVar42._0_8_ = 0x4110000041100000;
        auVar42._12_4_ = 0x41100000;
        uVar11 = uVar9 | 3;
        while ((int)uVar11 < (int)uVar12) {
          fVar23 = *(float *)*pauVar14;
          fVar24 = *(float *)(*pauVar14 + 4);
          fVar25 = *(float *)(*pauVar14 + 8);
          fVar5 = *(float *)(*pauVar14 + 0xc);
          auVar18._0_4_ = (fVar23 * fVar23 * fVar23 * 0.044715 + fVar23) * 0.7978845;
          auVar18._4_4_ = (fVar24 * fVar24 * fVar24 * 0.044715 + fVar24) * 0.7978845;
          auVar18._8_4_ = (fVar25 * fVar25 * fVar25 * 0.044715 + fVar25) * 0.7978845;
          auVar18._12_4_ = (fVar5 * fVar5 * fVar5 * 0.044715 + fVar5) * 0.7978845;
          auVar28._8_4_ = 0xc1100000;
          auVar28._0_8_ = 0xc1100000c1100000;
          auVar28._12_4_ = 0xc1100000;
          auVar18 = vmaxps_avx(auVar28,auVar18);
          auVar18 = vminps_avx(auVar42,auVar18);
          fVar17 = auVar18._0_4_;
          fVar27 = fVar17 * fVar17;
          fVar20 = auVar18._4_4_;
          fVar33 = fVar20 * fVar20;
          fVar21 = auVar18._8_4_;
          fVar35 = fVar21 * fVar21;
          fVar22 = auVar18._12_4_;
          fVar37 = fVar22 * fVar22;
          auVar19._0_4_ =
               ((((((fVar27 * -2.7607684e-16 + 2.000188e-13) * fVar27 + -8.604672e-11) * fVar27 +
                  5.1222973e-08) * fVar27 + 1.48572235e-05) * fVar27 + 0.00063726195) * fVar27 +
               0.0048935246) * fVar17;
          auVar19._4_4_ =
               ((((((fVar33 * -2.7607684e-16 + 2.000188e-13) * fVar33 + -8.604672e-11) * fVar33 +
                  5.1222973e-08) * fVar33 + 1.48572235e-05) * fVar33 + 0.00063726195) * fVar33 +
               0.0048935246) * fVar20;
          auVar19._8_4_ =
               ((((((fVar35 * -2.7607684e-16 + 2.000188e-13) * fVar35 + -8.604672e-11) * fVar35 +
                  5.1222973e-08) * fVar35 + 1.48572235e-05) * fVar35 + 0.00063726195) * fVar35 +
               0.0048935246) * fVar21;
          auVar19._12_4_ =
               ((((((fVar37 * -2.7607684e-16 + 2.000188e-13) * fVar37 + -8.604672e-11) * fVar37 +
                  5.1222973e-08) * fVar37 + 1.48572235e-05) * fVar37 + 0.00063726195) * fVar37 +
               0.0048935246) * fVar22;
          auVar29._0_4_ =
               ((fVar27 * 1.1982584e-06 + 0.00011853471) * fVar27 + 0.0022684347) * fVar27 +
               0.0048935246;
          auVar29._4_4_ =
               ((fVar33 * 1.1982584e-06 + 0.00011853471) * fVar33 + 0.0022684347) * fVar33 +
               0.0048935246;
          auVar29._8_4_ =
               ((fVar35 * 1.1982584e-06 + 0.00011853471) * fVar35 + 0.0022684347) * fVar35 +
               0.0048935246;
          auVar29._12_4_ =
               ((fVar37 * 1.1982584e-06 + 0.00011853471) * fVar37 + 0.0022684347) * fVar37 +
               0.0048935246;
          auVar18 = vrcpps_avx(auVar29);
          fVar17 = auVar19._0_4_ * auVar18._0_4_;
          fVar20 = auVar19._4_4_ * auVar18._4_4_;
          fVar21 = auVar19._8_4_ * auVar18._8_4_;
          fVar22 = auVar19._12_4_ * auVar18._12_4_;
          auVar30._0_4_ = auVar29._0_4_ * fVar17;
          auVar30._4_4_ = auVar29._4_4_ * fVar20;
          auVar30._8_4_ = auVar29._8_4_ * fVar21;
          auVar30._12_4_ = auVar29._12_4_ * fVar22;
          auVar19 = vsubps_avx(auVar19,auVar30);
          auVar16._0_4_ = fVar23 * 0.5 * (fVar17 + 1.0 + auVar18._0_4_ * auVar19._0_4_);
          auVar16._4_4_ = fVar24 * 0.5 * (fVar20 + 1.0 + auVar18._4_4_ * auVar19._4_4_);
          auVar16._8_4_ = fVar25 * 0.5 * (fVar21 + 1.0 + auVar18._8_4_ * auVar19._8_4_);
          auVar16._12_4_ = fVar5 * 0.5 * (fVar22 + 1.0 + auVar18._12_4_ * auVar19._12_4_);
          *(undefined1 (*) [16])*pauVar14 = auVar16;
          pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
          uVar11 = uVar9 + 7;
          uVar9 = uVar9 + 4;
        }
        if (uVar12 - uVar9 != 0 && (int)uVar9 <= (int)uVar12) {
          lVar15 = 0;
          do {
            fVar17 = *(float *)(*pauVar14 + lVar15 * 4);
            fVar20 = tanhf((fVar17 * fVar17 * 0.044715 * fVar17 + fVar17) * 0.7978845);
            *(float *)(*pauVar14 + lVar15 * 4) = (fVar20 + 1.0) * fVar17 * 0.5;
            lVar15 = lVar15 + 1;
          } while (uVar12 - uVar9 != (int)lVar15);
        }
        in_register_0000129c = 0.0;
        in_register_0000125c = 0.0;
        lVar13 = lVar13 + 1;
      } while (lVar13 != iVar10);
    }
    return 0;
  }
  iVar10 = GELU::forward_inplace
                     ((GELU *)((long)&this->_vptr_GELU_x86_avx + (long)this->_vptr_GELU_x86_avx[-3])
                      ,bottom_top_blob,opt);
  return iVar10;
}

Assistant:

int GELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}